

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 col_00;
  ImVec2 *p1;
  long in_RCX;
  uint in_EDX;
  int iVar4;
  ImVec2 *in_RSI;
  ImGuiTabBar *in_RDI;
  float fVar5;
  float fVar6;
  ImGuiPtrOrIndex IVar7;
  float separator_max_x_1;
  float separator_min_x_1;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPtrOrIndex *in_stack_ffffffffffffff48;
  ImGuiTabBar *in_stack_ffffffffffffff50;
  ImVector<ImGuiPtrOrIndex> *pIVar8;
  float in_stack_ffffffffffffff6c;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 local_80;
  ImVec2 local_78;
  float local_70;
  float local_6c;
  ImVec2 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_1c;
  bool local_1;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->SkipItems & 1U) == 0) {
    if ((in_EDX & 0x100000) == 0) {
      PushOverrideID((ImGuiID)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    }
    pIVar8 = &pIVar3->CurrentTabBarStack;
    IVar7 = GetTabBarRefFromTabBar(in_stack_ffffffffffffff50);
    p1 = (ImVec2 *)IVar7.Ptr;
    iVar4 = IVar7.Index;
    ImVector<ImGuiPtrOrIndex>::push_back
              ((ImVector<ImGuiPtrOrIndex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pIVar3->CurrentTabBar = in_RDI;
    if (in_RDI->CurrFrameVisible == pIVar3->FrameCount) {
      local_1 = true;
    }
    else {
      if (((((in_EDX & 1) != 0) && ((in_RDI->Flags & 1U) == 0)) && (1 < (in_RDI->Tabs).Size)) &&
         (in_RDI->PrevFrameVisible != -1)) {
        qsort((in_RDI->Tabs).Data,(long)(in_RDI->Tabs).Size,0x28,TabItemComparerByVisibleOffset);
      }
      local_1c = in_EDX;
      if ((in_EDX & 0xc0) == 0) {
        local_1c = in_EDX | 0x40;
      }
      in_RDI->Flags = local_1c;
      (in_RDI->BarRect).Min = *in_RSI;
      (in_RDI->BarRect).Max = in_RSI[1];
      in_RDI->WantLayout = true;
      in_RDI->PrevFrameVisible = in_RDI->CurrFrameVisible;
      in_RDI->CurrFrameVisible = pIVar3->FrameCount;
      in_RDI->FramePadding = (pIVar3->Style).FramePadding;
      fVar6 = in_RDI->OffsetMaxIdeal;
      fVar5 = ImRect::GetHeight(&in_RDI->BarRect);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,fVar6,fVar5);
      ItemSize((ImVec2 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      (pIVar2->DC).CursorPos.x = (in_RDI->BarRect).Min.x;
      col_00 = GetColorU32((ImGuiCol)((ulong)pIVar8 >> 0x20),SUB84(pIVar8,0));
      fVar6 = (in_RDI->BarRect).Max.y - 1.0;
      if (in_RCX == 0) {
        fVar5 = (in_RDI->BarRect).Max.x;
        fVar1 = (pIVar2->WindowPadding).x;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff70,
                       (in_RDI->BarRect).Min.x - (float)(int)((pIVar2->WindowPadding).x * 0.5),fVar6
                      );
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff68,fVar5 + (float)(int)(fVar1 * 0.5),fVar6);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,iVar4),p1,
                            (ImVec2 *)in_stack_ffffffffffffffa0,col_00,fVar6);
      }
      else {
        local_6c = *(float *)(in_RCX + 0x40) + pIVar2->WindowBorderSize;
        local_70 = (*(float *)(in_RCX + 0x40) + *(float *)(in_RCX + 0x48)) -
                   pIVar2->WindowBorderSize;
        ImVec2::ImVec2(&local_78,local_6c,fVar6);
        ImVec2::ImVec2(&local_80,local_70,fVar6);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,iVar4),p1,
                            (ImVec2 *)in_stack_ffffffffffffffa0,col_00,fVar6);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        //IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(tab_bar->OffsetMaxIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}